

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::RegrSXyState,double,double,duckdb::RegrSXYOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,RegrSXyState *state,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  long lVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint64_t uVar16;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0 && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar16 = (state->cov_pop).count;
      dVar13 = (state->cov_pop).meanx;
      dVar14 = (state->cov_pop).meany;
      dVar12 = (state->cov_pop).co_moment;
      iVar6 = 0;
      do {
        iVar9 = iVar6;
        if (asel->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)asel->sel_vector[iVar6];
        }
        iVar11 = iVar6;
        if (bsel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)bsel->sel_vector[iVar6];
        }
        lVar1 = uVar16 + 1 + iVar6;
        auVar18._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar18._0_8_ = lVar1;
        auVar18._12_4_ = 0x45300000;
        dVar17 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
        dVar20 = auVar18._8_8_ - 1.9342813113834067e+25;
        dVar21 = bdata[iVar11] - dVar13;
        auVar19._0_8_ = dVar20 + dVar17;
        auVar19._8_8_ = dVar20 + dVar17;
        auVar22._8_8_ = adata[iVar9] - dVar14;
        auVar22._0_8_ = dVar21;
        auVar23 = divpd(auVar22,auVar19);
        dVar13 = dVar13 + auVar23._0_8_;
        dVar14 = dVar14 + auVar23._8_8_;
        dVar12 = dVar12 + (adata[iVar9] - dVar14) * dVar21;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      state->count = state->count + count;
      (state->cov_pop).count = uVar16 + count;
      (state->cov_pop).meanx = dVar13;
      (state->cov_pop).meany = dVar14;
      (state->cov_pop).co_moment = dVar12;
    }
  }
  else if (count != 0) {
    psVar4 = asel->sel_vector;
    psVar5 = bsel->sel_vector;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (psVar4 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar4[uVar8];
      }
      uVar10 = uVar8;
      if (psVar5 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar5[uVar8];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) &&
         ((puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))))
      {
        uVar16 = (state->cov_pop).count + 1;
        state->count = state->count + 1;
        (state->cov_pop).count = uVar16;
        auVar23._8_4_ = (int)(uVar16 >> 0x20);
        auVar23._0_8_ = uVar16;
        auVar23._12_4_ = 0x45300000;
        dVar17 = (double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0;
        dVar20 = auVar23._8_8_ - 1.9342813113834067e+25;
        dVar12 = adata[uVar7];
        dVar13 = (state->cov_pop).meanx;
        dVar14 = (state->cov_pop).meany;
        dVar21 = bdata[uVar10] - dVar13;
        auVar15._0_8_ = dVar20 + dVar17;
        auVar15._8_8_ = dVar20 + dVar17;
        auVar24._8_8_ = dVar12 - dVar14;
        auVar24._0_8_ = dVar21;
        auVar23 = divpd(auVar24,auVar15);
        dVar14 = auVar23._8_8_ + dVar14;
        (state->cov_pop).meanx = auVar23._0_8_ + dVar13;
        (state->cov_pop).meany = dVar14;
        (state->cov_pop).co_moment = (dVar12 - dVar14) * dVar21 + (state->cov_pop).co_moment;
      }
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}